

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_unary_op.cxx
# Opt level: O1

void __thiscall HAXX_UNARY_OP::real_unary_assign::test_method(real_unary_assign *this)

{
  undefined8 local_160;
  double *local_158;
  undefined8 *local_150;
  double local_148;
  undefined **local_140;
  undefined1 local_138;
  undefined8 *local_130;
  double **local_128;
  undefined **local_120;
  undefined1 local_118;
  undefined8 *local_110;
  undefined8 **local_108;
  undefined1 local_100 [8];
  undefined8 local_f8;
  shared_count sStack_f0;
  char *local_e8;
  char *local_e0;
  undefined **local_d8;
  undefined1 local_d0;
  undefined8 *local_c8;
  char *local_c0;
  double x;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  x = -4.59;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x18);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_00151bb0;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_150 = &local_160;
  local_160 = 0xc0125c28f5c28f5c;
  local_100[0] = x == -4.59;
  local_f8 = 0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_e0 = "";
  local_108 = &local_150;
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_00151bf0;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &local_158;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bf0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_158 = &x;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f0);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x19);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_00151bb0;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_160 = 0;
  local_158 = &local_148;
  local_148 = 0.0;
  local_100[0] = 1;
  local_f8 = 0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_e0 = "";
  local_150 = &local_160;
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_00151bf0;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = &local_150;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bf0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &local_158;
  boost::test_tools::tt_detail::report_assertion
            (local_100,&local_d8,&local_e8,0x19,1,2,2,"q.imag_i()",&local_120,"0.",&local_140);
  boost::detail::shared_count::~shared_count(&sStack_f0);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x1a);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_00151bb0;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_160 = 0;
  local_148 = 0.0;
  local_100[0] = 1;
  local_f8 = 0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_e0 = "";
  local_150 = &local_160;
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_00151bf0;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = &local_150;
  local_158 = &local_148;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bf0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &local_158;
  boost::test_tools::tt_detail::report_assertion
            (local_100,&local_d8,&local_e8,0x1a,1,2,2,"q.imag_j()",&local_120,"0.",&local_140);
  boost::detail::shared_count::~shared_count(&sStack_f0);
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x1b);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_00151bb0;
  local_c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_160 = 0;
  local_148 = 0.0;
  local_100[0] = 1;
  local_f8 = 0;
  sStack_f0.pi_ = (sp_counted_base *)0x0;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_e0 = "";
  local_150 = &local_160;
  local_118 = 0;
  local_120 = &PTR__lazy_ostream_00151bf0;
  local_110 = &boost::unit_test::lazy_ostream::inst;
  local_108 = &local_150;
  local_158 = &local_148;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_00151bf0;
  local_130 = &boost::unit_test::lazy_ostream::inst;
  local_128 = &local_158;
  boost::test_tools::tt_detail::report_assertion
            (local_100,&local_d8,&local_e8,0x1b,1,2,2,"q.imag_k()",&local_120,"0.",&local_140);
  boost::detail::shared_count::~shared_count(&sStack_f0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(real_unary_assign)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.);
  double x = -4.59;
  q = x;

  // Check that q is unchanged
  BOOST_CHECK_EQUAL(q.real(),x);
  BOOST_CHECK_EQUAL(q.imag_i(),0.);
  BOOST_CHECK_EQUAL(q.imag_j(),0.);
  BOOST_CHECK_EQUAL(q.imag_k(),0.);

}